

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  long lVar3;
  
  pRVar2 = this->rep_;
  if ((pRVar2 != (Rep *)0x0) && (this->arena_ == (Arena *)0x0)) {
    iVar1 = pRVar2->allocated_size;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        if ((long *)pRVar2->elements[lVar3] != (long *)0x0) {
          (**(code **)(*pRVar2->elements[lVar3] + 8))();
        }
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
    operator_delete(this->rep_,(long)this->total_size_ * 8 + 8);
  }
  this->rep_ = (Rep *)0x0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  if (rep_ != NULL && arena_ == NULL) {
    int n = rep_->allocated_size;
    void* const* elements = rep_->elements;
    for (int i = 0; i < n; i++) {
      TypeHandler::Delete(cast<TypeHandler>(elements[i]), NULL);
    }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(rep_), size);
#else
    ::operator delete(static_cast<void*>(rep_));
#endif
  }
  rep_ = NULL;
}